

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

bool __thiscall QGraphicsScene::focusNextPrevChild(QGraphicsScene *this,bool next)

{
  QGraphicsWidget *pQVar1;
  byte bVar2;
  bool bVar3;
  Int IVar4;
  FocusPolicy FVar5;
  QGraphicsScenePrivate *pQVar6;
  QGraphicsItem *pQVar7;
  QGraphicsItem *pQVar8;
  QGraphicsWidgetPrivate *pQVar9;
  byte in_SIL;
  long in_FS_OFFSET;
  QGraphicsWidget *widgetThatHadFocus;
  QGraphicsWidget *test_1;
  QGraphicsWidget *widget;
  QGraphicsWidget *fw;
  QGraphicsWidget *test;
  QGraphicsItem *item;
  QGraphicsScenePrivate *d;
  GraphicsItemFlag in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  FocusReason in_stack_fffffffffffffee4;
  QGraphicsWidget *in_stack_fffffffffffffee8;
  QGraphicsWidget *in_stack_fffffffffffffef0;
  QGraphicsItem *in_stack_fffffffffffffef8;
  bool local_da;
  bool local_d9;
  QGraphicsWidget *local_d0;
  QGraphicsItem *local_a8;
  QGraphicsWidget *local_a0;
  bool local_19;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_14;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_10;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  pQVar6 = d_func((QGraphicsScene *)0x9d8c85);
  pQVar7 = focusItem((QGraphicsScene *)in_stack_fffffffffffffef0);
  if ((pQVar7 == (QGraphicsItem *)0x0) ||
     (bVar3 = QGraphicsItem::isWidget((QGraphicsItem *)0x9d8cba), bVar3)) {
    if (pQVar7 == (QGraphicsItem *)0x0) {
      if ((pQVar6->lastFocusItem != (QGraphicsItem *)0x0) &&
         (bVar3 = QGraphicsItem::isWidget((QGraphicsItem *)0x9d8d00), !bVar3)) {
        setFocusItem((QGraphicsScene *)in_stack_fffffffffffffef0,
                     (QGraphicsItem *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
        local_19 = true;
        goto LAB_009d93e2;
      }
      if (pQVar6->activePanel != (QGraphicsItem *)0x0) {
        local_10.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QGraphicsItem::flags
                       ((QGraphicsItem *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        local_c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                       ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
        if (IVar4 != 0) {
          setFocusItem((QGraphicsScene *)in_stack_fffffffffffffef0,
                       (QGraphicsItem *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
          local_19 = true;
          goto LAB_009d93e2;
        }
        bVar3 = QGraphicsItem::isWidget((QGraphicsItem *)0x9d8df4);
        if (bVar3) {
          if (bVar2 == 0) {
            QGraphicsWidget::d_func((QGraphicsWidget *)0x9d8e81);
          }
          else {
            QGraphicsWidget::d_func((QGraphicsWidget *)0x9d8e63);
          }
          do {
            FVar5 = QGraphicsWidget::focusPolicy
                              ((QGraphicsWidget *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            if ((FVar5 & TabFocus) != NoFocus) {
              setFocusItem((QGraphicsScene *)in_stack_fffffffffffffef0,
                           (QGraphicsItem *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
              local_19 = true;
              goto LAB_009d93e2;
            }
            if (bVar2 == 0) {
              pQVar9 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9d8f57);
              local_a0 = pQVar9->focusPrev;
            }
            else {
              pQVar9 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9d8f39);
              local_a0 = pQVar9->focusNext;
            }
            local_a8 = (QGraphicsItem *)0x0;
            if (local_a0 != (QGraphicsWidget *)0x0) {
              local_a8 = &(local_a0->super_QGraphicsObject).super_QGraphicsItem;
            }
          } while (local_a8 != pQVar6->activePanel);
        }
      }
    }
    if ((pQVar7 == (QGraphicsItem *)0x0) && (pQVar6->tabFocusFirst == (QGraphicsWidget *)0x0)) {
      local_19 = false;
    }
    else {
      if (pQVar7 == (QGraphicsItem *)0x0) {
        if (bVar2 == 0) {
          pQVar9 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9d903c);
          local_d0 = pQVar9->focusPrev;
        }
        else {
          local_d0 = pQVar6->tabFocusFirst;
        }
      }
      else {
        if (bVar2 == 0) {
          pQVar9 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9d90c5);
          local_d0 = pQVar9->focusPrev;
        }
        else {
          pQVar9 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9d90aa);
          local_d0 = pQVar9->focusNext;
        }
        pQVar8 = QGraphicsItem::panel((QGraphicsItem *)in_stack_fffffffffffffee8);
        if ((pQVar8 == (QGraphicsItem *)0x0) &&
           (((bVar2 != 0 && (local_d0 == pQVar6->tabFocusFirst)) ||
            ((bVar2 == 0 &&
             (pQVar9 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9d9143),
             local_d0 == pQVar9->focusPrev)))))) {
          local_19 = false;
          goto LAB_009d93e2;
        }
      }
      do {
        QGraphicsItem::flags
                  ((QGraphicsItem *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        local_14.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                       ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
        local_d9 = false;
        if (IVar4 != 0) {
          bVar3 = QGraphicsItem::isEnabled((QGraphicsItem *)0x9d91d3);
          local_d9 = false;
          if (bVar3) {
            bVar3 = QGraphicsItem::isVisibleTo
                              ((QGraphicsItem *)in_stack_fffffffffffffee8,
                               (QGraphicsItem *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            local_d9 = false;
            if (bVar3) {
              FVar5 = QGraphicsWidget::focusPolicy
                                ((QGraphicsWidget *)
                                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
              local_d9 = false;
              if ((FVar5 & TabFocus) != NoFocus) {
                local_da = true;
                if (pQVar7 != (QGraphicsItem *)0x0) {
                  bVar3 = QGraphicsItem::isPanel((QGraphicsItem *)0x9d9247);
                  local_da = true;
                  if (bVar3) {
                    local_da = QGraphicsItem::isAncestorOf
                                         (in_stack_fffffffffffffef8,
                                          (QGraphicsItem *)in_stack_fffffffffffffef0);
                  }
                }
                local_d9 = local_da;
              }
            }
          }
        }
        if (local_d9 != false) {
          setFocusItem((QGraphicsScene *)in_stack_fffffffffffffef0,
                       (QGraphicsItem *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
          local_19 = true;
          goto LAB_009d93e2;
        }
        if (bVar2 != 0) {
          pQVar9 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9d9325);
          pQVar1 = pQVar9->focusNext;
          if (pQVar1 != pQVar6->tabFocusFirst) goto LAB_009d937c;
LAB_009d93b8:
          local_19 = false;
          goto LAB_009d93e2;
        }
        pQVar9 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9d9340);
        pQVar1 = pQVar9->focusPrev;
LAB_009d937c:
        in_stack_fffffffffffffef0 = pQVar1;
        if ((bVar2 == 0) &&
           (in_stack_fffffffffffffee8 = pQVar1,
           pQVar9 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9d93a7),
           in_stack_fffffffffffffee8 == pQVar9->focusPrev)) goto LAB_009d93b8;
      } while (pQVar1 != local_d0);
      local_19 = false;
    }
  }
  else {
    local_19 = false;
  }
LAB_009d93e2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsScene::focusNextPrevChild(bool next)
{
    Q_D(QGraphicsScene);

    QGraphicsItem *item = focusItem();
    if (item && !item->isWidget()) {
        // Tab out of the scene.
        return false;
    }
    if (!item) {
        if (d->lastFocusItem && !d->lastFocusItem->isWidget()) {
            // Restore focus to the last focusable non-widget item that had
            // focus.
            setFocusItem(d->lastFocusItem, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
            return true;
        }
        if (d->activePanel) {
            if (d->activePanel->flags() & QGraphicsItem::ItemIsFocusable) {
                setFocusItem(d->activePanel, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
                return true;
            }
            if (d->activePanel->isWidget()) {
                QGraphicsWidget *test = static_cast<QGraphicsWidget *>(d->activePanel);
                QGraphicsWidget *fw = next ? test->d_func()->focusNext : test->d_func()->focusPrev;
                do {
                    if (fw->focusPolicy() & Qt::TabFocus) {
                        setFocusItem(fw, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
                        return true;
                    }
                    fw = next ? fw->d_func()->focusNext : fw->d_func()->focusPrev;
                } while (fw != d->activePanel);
            }
        }
    }
    if (!item && !d->tabFocusFirst) {
        // No widgets...
        return false;
    }

    // The item must be a widget.
    QGraphicsWidget *widget = nullptr;
    if (!item) {
        widget = next ? d->tabFocusFirst : d->tabFocusFirst->d_func()->focusPrev;
    } else {
        QGraphicsWidget *test = static_cast<QGraphicsWidget *>(item);
        widget = next ? test->d_func()->focusNext : test->d_func()->focusPrev;
        if (!widget->panel() && ((next && widget == d->tabFocusFirst) || (!next && widget == d->tabFocusFirst->d_func()->focusPrev))) {
            // Tab out of the scene.
            return false;
        }
    }
    QGraphicsWidget *widgetThatHadFocus = widget;

    // Run around the focus chain until we find a widget that can take tab focus.
    do {
        if (widget->flags() & QGraphicsItem::ItemIsFocusable
            && widget->isEnabled() && widget->isVisibleTo(nullptr)
            && (widget->focusPolicy() & Qt::TabFocus)
            && (!item || !item->isPanel() || item->isAncestorOf(widget))
            ) {
            setFocusItem(widget, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
            return true;
        }
        widget = next ? widget->d_func()->focusNext : widget->d_func()->focusPrev;
        if ((next && widget == d->tabFocusFirst) || (!next && widget == d->tabFocusFirst->d_func()->focusPrev))
            return false;
    } while (widget != widgetThatHadFocus);

    return false;
}